

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean MA_set_numalign(Integer value)

{
  Integer IVar1;
  
  ma_stats.calls[0x1b] = ma_stats.calls[0x1b] + 1;
  IVar1 = value;
  if ((ulong)value >= 0x1f) {
    sprintf(ma_ebuf,"invalid alignment: %ld");
    ma_error(EL_Nonfatal,ET_External,"MA_set_numalign",ma_ebuf);
    IVar1 = ma_numalign;
  }
  ma_numalign = IVar1;
  return (ulong)((ulong)value < 0x1f);
}

Assistant:

public Boolean MA_set_numalign(Integer  value)
{
#ifdef STATS
    ma_stats.calls[(int)FID_MA_set_numalign]++;
#endif /* STATS */

    if ((value < 0) || (value > 30))
    {
        (void)sprintf(ma_ebuf,
            "invalid alignment: %ld",
            (size_t)value);
        ma_error(EL_Nonfatal, ET_External, "MA_set_numalign", ma_ebuf);
        return MA_FALSE;
    }
    ma_numalign = value;
    return MA_TRUE;
}